

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O2

void __thiscall BufferedReader::~BufferedReader(BufferedReader *this)

{
  _Base_ptr p_Var1;
  int local_2c;
  
  (this->super_AbstractReader)._vptr_AbstractReader = (_func_int **)&PTR__BufferedReader_0024a108;
  (this->super_TerminatableThread)._vptr_TerminatableThread =
       (_func_int **)&PTR__BufferedReader_0024a198;
  this->m_terminated = true;
  local_2c = 0;
  SafeQueueWithNotification<int>::push
            (&(this->m_readQueue).super_SafeQueueWithNotification<int>,&local_2c);
  TerminatableThread::join(&this->super_TerminatableThread);
  for (p_Var1 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_ReaderData_*>,_std::_Select1st<std::pair<const_int,_ReaderData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
  ::~_Rb_tree(&(this->m_readers)._M_t);
  std::condition_variable::~condition_variable(&this->m_readCond);
  WaitableSafeQueue<int>::~WaitableSafeQueue(&this->m_readQueue);
  TerminatableThread::~TerminatableThread(&this->super_TerminatableThread);
  return;
}

Assistant:

BufferedReader::~BufferedReader()
{
    terminate();
    m_readQueue.push(0);
    join();
    for (const auto& m_reader : m_readers)
    {
        const ReaderData* pData = m_reader.second;
        delete pData;
    }
}